

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O2

string * __thiscall
MD5::getDataChecksum_abi_cxx11_(string *__return_storage_ptr__,MD5 *this,char *buf,size_t len)

{
  MD5 m;
  MD5 local_30;
  
  MD5(&local_30,(uchar *)this,(size_t)buf,(uchar *)len);
  encodeDataIncrementally(&local_30,(char *)this,(size_t)buf);
  unparse_abi_cxx11_(__return_storage_ptr__,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
MD5::getDataChecksum(char const* buf, size_t len)
{
    MD5 m;
    m.encodeDataIncrementally(buf, len);
    return m.unparse();
}